

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O3

void InsertNode(void)

{
  uint *puVar1;
  UINT8 *pUVar2;
  byte bVar3;
  uint uVar4;
  NODE_conflict *pNVar5;
  UINT8 *pUVar6;
  NODE_conflict *pNVar7;
  NODE_conflict *pNVar8;
  NODE_conflict NVar9;
  NODE_conflict NVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  NODE_conflict Node1;
  NODE_conflict *pNVar21;
  long lVar22;
  uint uVar23;
  byte *pbVar24;
  UINT8 *pUVar25;
  
  NVar9 = mPos;
  pNVar5 = mNext;
  pNVar7 = mParent;
  pNVar21 = mPosition;
  pUVar25 = mLevel;
  if (mMatchLen < 4) {
    lVar22 = (long)mPos;
    uVar19 = (ulong)mText[lVar22] + 0x80000;
    uVar17 = (uint)mText[lVar22] + (uint)mText[lVar22 + 1] * 0x400 + 0x180000;
    uVar11 = mNext[uVar17];
    iVar18 = (int)uVar19;
    *mParent = iVar18;
    while( true ) {
      uVar15 = (ulong)uVar11;
      if (pNVar7[(int)uVar11] == iVar18) break;
      uVar11 = pNVar5[(int)uVar11];
    }
    if (uVar11 == 0) {
      iVar13 = pNVar5[uVar17];
      pNVar5[uVar17] = NVar9;
      pNVar5[lVar22] = iVar13;
      pNVar21 = mPrev;
      mPrev[iVar13] = NVar9;
      pNVar21[lVar22] = uVar17;
      pNVar7[lVar22] = iVar18;
      mChildCount[uVar19] = mChildCount[uVar19] + '\x01';
      mMatchLen = 1;
      return;
    }
    mMatchLen = 2;
    uVar11 = 2;
    pNVar5 = mNext;
    pUVar6 = mText;
    pUVar25 = mLevel;
    pNVar21 = mPosition;
  }
  else {
    uVar11 = mMatchLen - 1;
    uVar15 = (long)mMatchPos + 1U | 0x80000;
    uVar17 = mParent[uVar15];
    while (uVar17 == 0) {
      uVar15 = (ulong)mNext[(int)uVar15];
      uVar17 = mParent[uVar15];
    }
    lVar22 = (long)(int)uVar17;
    bVar3 = mLevel[lVar22];
    while ((int)uVar11 <= (int)(uint)bVar3) {
      puVar1 = (uint *)(mParent + lVar22);
      lVar22 = (long)(int)*puVar1;
      uVar15 = (ulong)uVar17;
      uVar17 = *puVar1;
      bVar3 = mLevel[lVar22];
    }
    uVar19 = (ulong)uVar17;
    iVar18 = mPosition[lVar22];
    mMatchLen = uVar11;
    while (iVar18 < 0) {
      pNVar21[lVar22] = NVar9;
      uVar17 = pNVar7[lVar22];
      lVar22 = (long)(int)uVar17;
      iVar18 = pNVar21[lVar22];
    }
    pNVar5 = mNext;
    pUVar6 = mText;
    if ((int)uVar17 < 0x80000) {
      pNVar21[lVar22] = NVar9 | 0x80000000;
      pNVar5 = mNext;
      pUVar6 = mText;
    }
  }
  while( true ) {
    NVar10 = mAvail;
    pNVar8 = mPrev;
    pUVar2 = mChildCount;
    uVar14 = (uint)uVar15;
    uVar16 = uVar15 & 0xffffffff;
    uVar23 = 0x100;
    uVar17 = uVar14;
    if ((int)uVar14 < 0x80000) {
      uVar23 = (uint)pUVar25[(int)uVar14];
      uVar17 = pNVar21[(int)uVar14] & 0x7fffffff;
    }
    uVar4 = uVar17 - 0x80000;
    if ((int)uVar17 < NVar9) {
      uVar4 = uVar17;
    }
    pbVar24 = pUVar6 + (int)(uVar11 + NVar9);
    mMatchPos = uVar4;
    if ((int)uVar11 < (int)uVar23) {
      lVar22 = 0;
      do {
        if (pbVar24[lVar22] != pUVar6[lVar22 + (int)(uVar4 + uVar11)]) {
          lVar20 = (long)mAvail;
          mAvail = pNVar5[lVar20];
          mChildCount[lVar20] = '\0';
          pNVar8 = mPrev;
          iVar18 = mPrev[(int)uVar14];
          mPrev[lVar20] = iVar18;
          pNVar5[iVar18] = NVar10;
          iVar18 = pNVar5[(int)uVar14];
          pNVar5[lVar20] = iVar18;
          pNVar8[iVar18] = NVar10;
          pNVar7[lVar20] = pNVar7[(int)uVar14];
          iVar12 = uVar11 + (int)lVar22;
          pUVar25[lVar20] = (UINT8)iVar12;
          pNVar21[lVar20] = NVar9;
          iVar13 = (uint)pUVar6[(int)(uVar4 + iVar12)] * 0x400 + NVar10 + 0x100000;
          iVar18 = pNVar5[iVar13];
          pNVar5[iVar13] = uVar14;
          pNVar5[(int)uVar14] = iVar18;
          pNVar8[iVar18] = uVar14;
          pNVar8[(int)uVar14] = iVar13;
          pNVar7[(int)uVar14] = NVar10;
          pUVar25 = pUVar2 + lVar20;
          *pUVar25 = *pUVar25 + '\x01';
          iVar13 = (uint)pUVar6[iVar12 + NVar9] * 0x400 + NVar10 + 0x100000;
          iVar18 = pNVar5[iVar13];
          pNVar5[iVar13] = NVar9;
          lVar22 = (long)NVar9;
          pNVar5[lVar22] = iVar18;
          pNVar8[iVar18] = NVar9;
          pNVar8[lVar22] = iVar13;
          pNVar7[lVar22] = NVar10;
          pUVar2 = pUVar2 + lVar20;
          *pUVar2 = *pUVar2 + '\x01';
          return;
        }
        mMatchLen = uVar11 + (int)lVar22 + 1;
        lVar22 = lVar22 + 1;
      } while ((uVar11 - uVar23) + (int)lVar22 != 0);
      pbVar24 = pbVar24 + lVar22;
      uVar11 = uVar23;
    }
    if (0xff < (int)uVar11) break;
    pNVar21[(int)uVar14] = NVar9;
    uVar17 = pNVar5[(uint)*pbVar24 * 0x400 + uVar14 + 0x100000];
    *pNVar7 = uVar14;
    lVar22 = (long)(int)uVar17;
    uVar23 = pNVar7[lVar22];
    while (uVar23 != uVar14) {
      uVar17 = pNVar5[lVar22];
      lVar22 = (long)(int)uVar17;
      uVar23 = pNVar7[lVar22];
    }
    uVar15 = (ulong)uVar17;
    if (uVar17 == 0) {
      iVar13 = (uint)*pbVar24 * 0x400 + uVar14 + 0x100000;
      iVar18 = pNVar5[iVar13];
      pNVar5[iVar13] = NVar9;
      lVar22 = (long)NVar9;
      pNVar5[lVar22] = iVar18;
      pNVar21 = mPrev;
      mPrev[iVar18] = NVar9;
      pNVar21[lVar22] = iVar13;
      pNVar7[lVar22] = uVar14;
      mChildCount[(int)uVar14] = mChildCount[(int)uVar14] + '\x01';
      return;
    }
    uVar11 = uVar11 + 1;
    uVar19 = uVar16;
    mMatchLen = uVar11;
  }
  iVar18 = mPrev[(int)uVar14];
  lVar22 = (long)NVar9;
  mPrev[lVar22] = iVar18;
  pNVar5[iVar18] = NVar9;
  iVar18 = pNVar5[(int)uVar14];
  pNVar5[lVar22] = iVar18;
  pNVar8[iVar18] = NVar9;
  pNVar7[lVar22] = (NODE_conflict)uVar19;
  pNVar7[(int)uVar14] = 0;
  pNVar5[(int)uVar14] = NVar9;
  return;
}

Assistant:

STATIC
  VOID
  InsertNode (
  VOID
  )
  /*++

  Routine Description:

  Insert string info for current position into the String Info Log

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
  NODE  NodeQ;
  NODE  NodeR;
  NODE  Index2;
  NODE  NodeT;
  UINT8 CharC;
  UINT8 *t1;
  UINT8 *t2;

  if (mMatchLen >= 4) {
    //
    // We have just got a long match, the target tree
    // can be located by MatchPos + 1. Traverse the tree
    // from bottom up to get to a proper starting point.
    // The usage of PERC_FLAG ensures proper node deletion
    // DeleteNode() later.
    //
    mMatchLen--;
    NodeR = (NODE) ((mMatchPos + 1) | WNDSIZ);
    NodeQ = mParent[NodeR];
    while (NodeQ == NIL) {
      NodeR = mNext[NodeR];
      NodeQ = mParent[NodeR];
    }

    while (mLevel[NodeQ] >= mMatchLen) {
      NodeR = NodeQ;
      NodeQ = mParent[NodeQ];
    }

    NodeT = NodeQ;
    while (mPosition[NodeT] < 0) {
      mPosition[NodeT]  = mPos;
      NodeT             = mParent[NodeT];
    }

        if (NodeT < (NODE) WNDSIZ) {
      mPosition[NodeT] = (NODE) (mPos | (UINT32) PERC_FLAG);
    }
  } else {
    //
    // Locate the target tree
    //
    NodeQ = (NODE) (mText[mPos] + WNDSIZ);
    CharC = mText[mPos + 1];
    NodeR = Child (NodeQ, CharC);
    if (NodeR == NIL) {
      MakeChild (NodeQ, CharC, mPos);
      mMatchLen = 1;
      return ;
    }

    mMatchLen = 2;
  }
  //
  // Traverse down the tree to find a match.
  // Update Position value along the route.
  // Node split or creation is involved.
  //
  for (;;) {
        if (NodeR >= (NODE) WNDSIZ) {
      Index2    = MAXMATCH;
      mMatchPos = NodeR;
    } else {
      Index2    = mLevel[NodeR];
      mMatchPos = (NODE) (mPosition[NodeR] & (UINT32)~PERC_FLAG);
    }

    if (mMatchPos >= mPos) {
      mMatchPos -= WNDSIZ;
    }

    t1  = &mText[mPos + mMatchLen];
    t2  = &mText[mMatchPos + mMatchLen];
    while (mMatchLen < Index2) {
      if (*t1 != *t2) {
        Split (NodeR);
        return ;
      }

      mMatchLen++;
      t1++;
      t2++;
    }

    if (mMatchLen >= MAXMATCH) {
      break;
    }

    mPosition[NodeR]  = mPos;
    NodeQ             = NodeR;
    NodeR             = Child (NodeQ, *t1);
    if (NodeR == NIL) {
      MakeChild (NodeQ, *t1, mPos);
      return ;
    }

    mMatchLen++;
  }

  NodeT           = mPrev[NodeR];
  mPrev[mPos]     = NodeT;
  mNext[NodeT]    = mPos;
  NodeT           = mNext[NodeR];
  mNext[mPos]     = NodeT;
  mPrev[NodeT]    = mPos;
  mParent[mPos]   = NodeQ;
  mParent[NodeR]  = NIL;

  //
  // Special usage of 'next'
  //
  mNext[NodeR] = mPos;

}